

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

void __thiscall duckdb::HistogramBinState<int>::Destroy(HistogramBinState<int> *this)

{
  _Vector_base<int,_std::allocator<int>_> *this_00;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  
  this_00 = (_Vector_base<int,_std::allocator<int>_> *)this->bin_boundaries;
  if (this_00 != (_Vector_base<int,_std::allocator<int>_> *)0x0) {
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(this_00);
    operator_delete(this_00);
    this->bin_boundaries = (unsafe_vector<int> *)0x0;
  }
  this_01 = (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)this->counts;
  if (this_01 != (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(this_01);
    operator_delete(this_01);
    this->counts = (unsafe_vector<idx_t> *)0x0;
  }
  return;
}

Assistant:

void Destroy() {
		if (bin_boundaries) {
			delete bin_boundaries;
			bin_boundaries = nullptr;
		}
		if (counts) {
			delete counts;
			counts = nullptr;
		}
	}